

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O0

vrna_param_t * copy_parameters(void)

{
  undefined1 local_800 [8];
  vrna_md_t md;
  vrna_param_t *copy;
  
  if (p.id == id) {
    md.pair[0x14]._76_8_ = vrna_alloc(0x33ea8);
    memcpy((void *)md.pair[0x14]._76_8_,&p,0x33ea8);
    copy = (vrna_param_t *)md.pair[0x14]._76_8_;
  }
  else {
    set_model_details((vrna_md_t *)local_800);
    copy = vrna_params((vrna_md_t *)local_800);
  }
  return copy;
}

Assistant:

PUBLIC vrna_param_t *
copy_parameters(void)
{
  vrna_param_t *copy;

  if (p.id != id) {
    vrna_md_t md;
    set_model_details(&md);
    return vrna_params(&md);
  } else {
    copy = (vrna_param_t *)vrna_alloc(sizeof(vrna_param_t));
    memcpy(copy, &p, sizeof(vrna_param_t));
  }

  return copy;
}